

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildUint8x16_3Int16
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,RegSlot src4RegSlot,
          RegSlot src5RegSlot,RegSlot src6RegSlot,RegSlot src7RegSlot,RegSlot src8RegSlot,
          RegSlot src9RegSlot,RegSlot src10RegSlot,RegSlot src11RegSlot,RegSlot src12RegSlot,
          RegSlot src13RegSlot,RegSlot src14RegSlot,RegSlot src15RegSlot,RegSlot src16RegSlot,
          RegSlot src17RegSlot,RegSlot src18RegSlot)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  RegOpnd *pRVar4;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *src1_01;
  RegOpnd *src1_02;
  RegOpnd *src1_03;
  RegOpnd *src1_04;
  RegOpnd *src1_05;
  RegOpnd *src1_06;
  RegOpnd *src1_07;
  RegOpnd *src1_08;
  RegOpnd *src1_09;
  RegOpnd *src1_10;
  RegOpnd *src1_11;
  RegOpnd *src1_12;
  RegOpnd *src1_13;
  RegOpnd *src1_14;
  RegOpnd *src1_15;
  RegOpnd *this_00;
  Instr *pIVar5;
  undefined4 *puVar6;
  
  pRVar4 = BuildSrcOpnd(this,src1RegSlot,TySimd128U16);
  src1 = BuildSrcOpnd(this,src2RegSlot,TySimd128U16);
  src1_00 = BuildIntConstOpnd(this,src3RegSlot);
  src1_01 = BuildIntConstOpnd(this,src4RegSlot);
  src1_02 = BuildIntConstOpnd(this,src5RegSlot);
  src1_03 = BuildIntConstOpnd(this,src6RegSlot);
  src1_04 = BuildIntConstOpnd(this,src7RegSlot);
  src1_05 = BuildIntConstOpnd(this,src8RegSlot);
  src1_06 = BuildIntConstOpnd(this,src9RegSlot);
  src1_07 = BuildIntConstOpnd(this,src10RegSlot);
  src1_08 = BuildIntConstOpnd(this,src11RegSlot);
  src1_09 = BuildIntConstOpnd(this,src12RegSlot);
  src1_10 = BuildIntConstOpnd(this,src13RegSlot);
  src1_11 = BuildIntConstOpnd(this,src14RegSlot);
  src1_12 = BuildIntConstOpnd(this,src15RegSlot);
  src1_13 = BuildIntConstOpnd(this,src16RegSlot);
  src1_14 = BuildIntConstOpnd(this,src17RegSlot);
  src1_15 = BuildIntConstOpnd(this,src18RegSlot);
  this_00 = BuildDstOpnd(this,dstRegSlot,TySimd128U16);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x4000);
  IR::Opnd::SetValueType(&pRVar4->super_Opnd,(ValueType)0x4000);
  IR::Opnd::SetValueType(&src1->super_Opnd,(ValueType)0x4000);
  pIVar5 = AddExtendedArg(this,pRVar4,(RegOpnd *)0x0,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_00,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_01,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_02,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_03,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_04,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_05,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_06,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_07,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_08,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_09,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_10,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_11,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_12,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_13,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_14,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005076e6;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_15,pRVar4,offset);
  if (newOpcode != Simd128_Shuffle_U16) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1793,"(newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_U16)",
                       "newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_U16");
    if (!bVar3) {
LAB_005076e6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pIVar5 = IR::Instr::New(Simd128_Shuffle_U16,&this_00->super_Opnd,pIVar5->m_dst,this->m_func);
  AddInstr(this,pIVar5,offset);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildUint8x16_3Int16(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG19)
{
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128U16);
    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TySimd128U16);

    IR::RegOpnd * src3Opnd = BuildIntConstOpnd(src3RegSlot);
    IR::RegOpnd * src4Opnd = BuildIntConstOpnd(src4RegSlot);
    IR::RegOpnd * src5Opnd = BuildIntConstOpnd(src5RegSlot);
    IR::RegOpnd * src6Opnd = BuildIntConstOpnd(src6RegSlot);
    IR::RegOpnd * src7Opnd = BuildIntConstOpnd(src7RegSlot);
    IR::RegOpnd * src8Opnd = BuildIntConstOpnd(src8RegSlot);
    IR::RegOpnd * src9Opnd = BuildIntConstOpnd(src9RegSlot);
    IR::RegOpnd * src10Opnd = BuildIntConstOpnd(src10RegSlot);
    IR::RegOpnd * src11Opnd = BuildIntConstOpnd(src11RegSlot);
    IR::RegOpnd * src12Opnd = BuildIntConstOpnd(src12RegSlot);
    IR::RegOpnd * src13Opnd = BuildIntConstOpnd(src13RegSlot);
    IR::RegOpnd * src14Opnd = BuildIntConstOpnd(src14RegSlot);
    IR::RegOpnd * src15Opnd = BuildIntConstOpnd(src15RegSlot);
    IR::RegOpnd * src16Opnd = BuildIntConstOpnd(src16RegSlot);
    IR::RegOpnd * src17Opnd = BuildIntConstOpnd(src17RegSlot);
    IR::RegOpnd * src18Opnd = BuildIntConstOpnd(src18RegSlot);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U16);

    IR::Instr * instr = nullptr;
    dstOpnd->SetValueType(ValueType::Simd);
    src1Opnd->SetValueType(ValueType::Simd);
    src2Opnd->SetValueType(ValueType::Simd);

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src3Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src4Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src5Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src6Opnd, instr->GetDst()->AsRegOpnd(), offset);

    instr = AddExtendedArg(src7Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src8Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src9Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src10Opnd, instr->GetDst()->AsRegOpnd(), offset);

    instr = AddExtendedArg(src11Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src12Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src13Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src14Opnd, instr->GetDst()->AsRegOpnd(), offset);

    instr = AddExtendedArg(src15Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src16Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src17Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src18Opnd, instr->GetDst()->AsRegOpnd(), offset);

    Assert(newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_U16);
    Js::OpCode opcode = Js::OpCode::Simd128_Shuffle_U16;

    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}